

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O0

optional<unsigned_char> __thiscall
nesvis::MemoryWidget::read_mem
          (MemoryWidget *this,function<unsigned_char_(unsigned_short)> *memory_read_func,
          uint16_t address)

{
  InvalidAddress *anon_var_0;
  uchar local_23;
  uint16_t local_22;
  function<unsigned_char_(unsigned_short)> *pfStack_20;
  uint16_t address_local;
  function<unsigned_char_(unsigned_short)> *memory_read_func_local;
  MemoryWidget *this_local;
  
  local_22 = address;
  pfStack_20 = memory_read_func;
  memory_read_func_local = (function<unsigned_char_(unsigned_short)> *)this;
  local_23 = std::function<unsigned_char_(unsigned_short)>::operator()(memory_read_func,address);
  std::optional<unsigned_char>::optional<unsigned_char,_true>
            ((optional<unsigned_char> *)((long)&this_local + 6),&local_23);
  return (optional<unsigned_char>)this_local._6_2_;
}

Assistant:

std::optional<uint8_t> read_mem(
            const std::function<uint8_t(uint16_t)> &memory_read_func,
            const uint16_t address) {
        try {
            return memory_read_func(address);
        } catch (n_e_s::core::InvalidAddress &) {
            return std::nullopt;
        }
    }